

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<int>::SolveEigensystemJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,REAL *tol,TPZVec<int> *Eigenvalues,
          TPZFMatrix<int> *Eigenvectors)

{
  double dVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int64_t iVar6;
  int *piVar7;
  TPZVec<int> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  __type_conflict _Var8;
  __type_conflict _Var9;
  double dVar10;
  int val;
  int64_t i_9;
  int exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  int exp;
  int answ;
  TPZFNMatrix<9,_int> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_int> VecIni_cp;
  TPZFNMatrix<3,_int> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_int> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  TPZFMatrix<int> *in_stack_fffffffffffffa28;
  TPZMatrix<int> *in_stack_fffffffffffffa30;
  __type_conflict in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa44;
  TPZFMatrix<int> *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa54;
  int64_t in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  int *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  TPZFMatrix<int> *in_stack_fffffffffffffa80;
  TPZVec<int> *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  int64_t *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  int local_464;
  long local_460;
  long local_450;
  long local_448;
  double local_440;
  long local_438;
  double local_430;
  double local_428;
  long local_420;
  long local_418;
  long local_410;
  double local_408;
  long local_3f8;
  long local_3e8;
  long local_288;
  long local_280;
  long local_110;
  long local_108;
  bool local_1;
  
  lVar3 = *in_RSI;
  dVar1 = *in_RDX;
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_int>::TPZFNMatrix
            ((TPZFNMatrix<9,_int> *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
  for (local_108 = 0; local_108 < iVar6; local_108 = local_108 + 1) {
    for (local_110 = 0; local_110 < iVar6; local_110 = local_110 + 1) {
      in_stack_fffffffffffffb8c =
           (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_108,local_110);
      in_stack_fffffffffffffb80 =
           (int64_t *)
           TPZFMatrix<int>::operator()
                     ((TPZFMatrix<int> *)
                      CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                      (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
      *(int *)in_stack_fffffffffffffb80 = in_stack_fffffffffffffb8c;
    }
  }
  bVar4 = SolveEigenvaluesJacobi
                    ((TPZMatrix<int> *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                     ,in_stack_fffffffffffffb80,
                     (REAL *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                     in_stack_fffffffffffffb70);
  if (bVar4) {
    TPZFNMatrix<3,_int>::TPZFNMatrix
              ((TPZFNMatrix<3,_int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa58,
               CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
               (int *)in_stack_fffffffffffffa48);
    TPZFNMatrix<3,_int>::TPZFNMatrix
              ((TPZFNMatrix<3,_int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa58,
               CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
               (int *)in_stack_fffffffffffffa48);
    (**(code **)(*in_R8 + 0x68))(in_R8,iVar6);
    (**(code **)(*in_R8 + 0x78))();
    for (local_280 = 0; local_280 < iVar6; local_280 = local_280 + 1) {
      for (local_288 = 0; local_288 < iVar6; local_288 = local_288 + 1) {
        rand();
        TPZFMatrix<int>::PutVal
                  ((TPZFMatrix<int> *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30,
                   (int *)in_stack_fffffffffffffa28);
      }
      TPZFMatrix<int>::TPZFMatrix
                (in_stack_fffffffffffffa80,
                 (TPZMatrix<int> *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      TPZFNMatrix<9,_int>::TPZFNMatrix
                ((TPZFNMatrix<9,_int> *)
                 CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48);
      TPZFMatrix<int>::~TPZFMatrix((TPZFMatrix<int> *)0x12f3035);
      TPZVec<int>::operator[](in_RCX,local_280);
      iVar5 = ReturnNearestValue((int)((ulong)in_stack_fffffffffffffa80 >> 0x20),
                                 (TPZVec<int> *)
                                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                                 (int)((ulong)in_stack_fffffffffffffa70 >> 0x20));
      piVar7 = TPZVec<int>::operator[](in_RCX,local_280);
      iVar2 = *piVar7;
      _Var8 = std::fabs<int>(iVar5 - iVar2);
      if (_Var8 <= 1e-05) {
        for (local_3f8 = 0; local_3f8 < iVar6; local_3f8 = local_3f8 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_3f8);
          TPZVec<int>::operator[](in_RCX,local_280);
          TPZFMatrix<int>::PutVal
                    ((TPZFMatrix<int> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30,
                     (int *)in_stack_fffffffffffffa28);
        }
      }
      else {
        for (local_3e8 = 0; local_3e8 < iVar6; local_3e8 = local_3e8 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_3e8);
          TPZVec<int>::operator[](in_RCX,local_280);
          std::fabs<int>(iVar5 - iVar2);
          TPZFMatrix<int>::PutVal
                    ((TPZFMatrix<int> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30,
                     (int *)in_stack_fffffffffffffa28);
        }
      }
      local_408 = 0.0;
      for (local_410 = 0; local_410 < iVar6; local_410 = local_410 + 1) {
        piVar7 = TPZFMatrix<int>::operator()
                           ((TPZFMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
        _Var8 = std::fabs<int>(*piVar7);
        piVar7 = TPZFMatrix<int>::operator()
                           ((TPZFMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
        _Var9 = std::fabs<int>(*piVar7);
        local_408 = _Var8 * _Var9 + local_408;
      }
      dVar10 = sqrt(local_408);
      for (local_418 = 0; local_418 < iVar6; local_418 = local_418 + 1) {
        piVar7 = TPZFMatrix<int>::operator()
                           ((TPZFMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
        iVar2 = *piVar7;
        piVar7 = TPZFMatrix<int>::operator()
                           ((TPZFMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
        *piVar7 = iVar2 / (int)dVar10;
      }
      local_428 = 10.0;
      for (local_420 = 0; dVar1 < local_428 && local_420 <= lVar3; local_420 = local_420 + 1) {
        for (local_438 = 0; local_438 < iVar6; local_438 = local_438 + 1) {
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          iVar2 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          *piVar7 = iVar2;
        }
        Solve_LU(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        local_440 = 0.0;
        for (local_448 = 0; local_448 < iVar6; local_448 = local_448 + 1) {
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          _Var8 = std::fabs<int>(*piVar7);
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          _Var9 = std::fabs<int>(*piVar7);
          local_440 = _Var8 * _Var9 + local_440;
        }
        dVar10 = sqrt(local_440);
        local_430 = 0.0;
        for (local_450 = 0; local_450 < iVar6; local_450 = local_450 + 1) {
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          in_stack_fffffffffffffa7c = *piVar7 / (int)dVar10;
          in_stack_fffffffffffffa80 =
               (TPZFMatrix<int> *)
               TPZFMatrix<int>::operator()
                         ((TPZFMatrix<int> *)
                          CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                          (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
          *(int *)&(in_stack_fffffffffffffa80->super_TPZMatrix<int>).super_TPZBaseMatrix.
                   super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffffa7c;
          in_stack_fffffffffffffa70 =
               TPZFMatrix<int>::operator()
                         ((TPZFMatrix<int> *)
                          CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                          (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
          in_stack_fffffffffffffa54 = *in_stack_fffffffffffffa70;
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          in_stack_fffffffffffffa54 = in_stack_fffffffffffffa54 - *piVar7;
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30)
          ;
          in_stack_fffffffffffffa44 = *piVar7;
          in_stack_fffffffffffffa48 =
               (TPZFMatrix<int> *)
               TPZFMatrix<int>::operator()
                         ((TPZFMatrix<int> *)
                          CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                          (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
          in_stack_fffffffffffffa38 =
               std::fabs<int>(in_stack_fffffffffffffa54 *
                              (in_stack_fffffffffffffa44 -
                              *(int *)&(in_stack_fffffffffffffa48->super_TPZMatrix<int>).
                                       super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable));
          local_430 = in_stack_fffffffffffffa38 + local_430;
        }
        local_428 = sqrt(local_430);
      }
      for (local_460 = 0; local_460 < iVar6; local_460 = local_460 + 1) {
        in_stack_fffffffffffffa30 =
             (TPZMatrix<int> *)
             TPZFMatrix<int>::operator()
                       ((TPZFMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
        local_464 = *(int *)&(in_stack_fffffffffffffa30->super_TPZBaseMatrix).super_TPZSavable.
                             _vptr_TPZSavable;
        in_stack_fffffffffffffa28 = (TPZFMatrix<int> *)std::fabs<int>(local_464);
        if ((double)in_stack_fffffffffffffa28 < 1e-05) {
          local_464 = 0;
        }
        piVar7 = TPZFMatrix<int>::operator()
                           ((TPZFMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (int64_t)in_stack_fffffffffffffa38,(int64_t)in_stack_fffffffffffffa30);
        *piVar7 = local_464;
      }
      TPZFNMatrix<9,_int>::~TPZFNMatrix((TPZFNMatrix<9,_int> *)0x12f39c5);
    }
    local_1 = true;
    TPZFNMatrix<3,_int>::~TPZFNMatrix((TPZFNMatrix<3,_int> *)0x12f39fe);
    TPZFNMatrix<3,_int>::~TPZFNMatrix((TPZFNMatrix<3,_int> *)0x12f3a0b);
  }
  else {
    local_1 = false;
  }
  TPZFNMatrix<9,_int>::~TPZFNMatrix((TPZFNMatrix<9,_int> *)0x12f3a36);
  return local_1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}